

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O2

timespec * Time::getInitialTimespec(void)

{
  int iVar1;
  timespec *in_RAX;
  timespec mt;
  TimeVal now;
  TimeVal now_1;
  
  if (getInitialTimespec()::initialized == '\0') {
    iVar1 = clock_gettime(0,(timespec *)&getInitialTimespec::ts);
    if (iVar1 == 0x16) {
      gettimeofday((timeval *)&now,(__timezone_ptr_t)0x0);
      getInitialTimespec::ts.tv_sec = now.tv_sec;
      getInitialTimespec::ts.tv_nsec = now.tv_usec * 1000;
    }
    iVar1 = clock_gettime(1,(timespec *)&now);
    if (iVar1 == 0x16) {
      gettimeofday((timeval *)&now_1,(__timezone_ptr_t)0x0);
      now.tv_usec = now_1.tv_usec * 1000;
      now.tv_sec = now_1.tv_sec;
    }
    getInitialTimespec::ts.tv_sec = getInitialTimespec::ts.tv_sec - now.tv_sec;
    if (getInitialTimespec::ts.tv_nsec < now.tv_usec) {
      getInitialTimespec::ts.tv_sec = getInitialTimespec::ts.tv_sec + -1;
      getInitialTimespec::ts.tv_nsec = getInitialTimespec::ts.tv_nsec + 1000000000;
    }
    getInitialTimespec::ts.tv_nsec = getInitialTimespec::ts.tv_nsec - now.tv_usec;
    getInitialTimespec()::initialized = '\x01';
    in_RAX = (timespec *)now.tv_usec;
  }
  return in_RAX;
}

Assistant:

static struct timespec & getInitialTimespec()
    {
        static struct timespec ts;
        struct timespec mt;
        static bool initialized = false;
        if (!initialized)
        {
            if (clock_gettime(CLOCK_REALTIME, &ts) == EINVAL)
            {
                TimeVal now;
                gettimeofday(&now, NULL);
                ts.tv_sec = now.tv_sec;
                ts.tv_nsec = now.tv_usec * 1000;
            }
            if (clock_gettime(CLOCK_MONOTONIC, &mt) == EINVAL)
            {
                TimeVal now;
                gettimeofday(&now, NULL);
                mt.tv_sec = now.tv_sec;
                mt.tv_nsec = now.tv_usec * 1000;
            }
            ts.tv_sec -= mt.tv_sec;
            if (mt.tv_nsec > ts.tv_nsec) { ts.tv_sec --; ts.tv_nsec = ts.tv_nsec + 1000000000 - mt.tv_nsec; }
            else ts.tv_nsec -= mt.tv_nsec;
            initialized = true;
        }
        return ts;
    }